

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTreeViewItem>::appendInitialize
          (QArrayDataPointer<QTreeViewItem> *this,qsizetype newSize)

{
  QTreeViewItem *pQVar1;
  QAbstractItemModel *in_RSI;
  QTreeViewItem *in_RDI;
  QTreeViewItem *e;
  QTreeViewItem *b;
  
  begin((QArrayDataPointer<QTreeViewItem> *)0x90c7c0);
  pQVar1 = begin((QArrayDataPointer<QTreeViewItem> *)0x90c7d6);
  std::uninitialized_value_construct<QTreeViewItem*>(pQVar1 + (long)in_RSI,in_RDI);
  (in_RDI->index).m.ptr = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }